

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

bool __thiscall bssl::seal_next_packet(bssl *this,SSL *ssl,Span<unsigned_char> out,size_t *out_len)

{
  seal_result_t sVar1;
  Span<unsigned_char> SVar2;
  SSL *local_68;
  uchar *local_60;
  size_t sStack_40;
  seal_result_t ret;
  size_t len;
  size_t total;
  size_t *out_len_local;
  SSL *ssl_local;
  Span<unsigned_char> out_local;
  
  total = out.size_;
  out_local.data_ = out.data_;
  len = 0;
  out_len_local = (size_t *)this;
  ssl_local = ssl;
  do {
    SVar2.size_ = (size_t)out_local.data_;
    SVar2.data_ = (uchar *)ssl_local;
    sVar1 = seal_next_record((SSL *)out_len_local,SVar2,&stack0xffffffffffffffc0);
    if (sVar1 == seal_error) {
      return false;
    }
    if (sVar1 - seal_continue < 2) {
      SVar2 = Span<unsigned_char>::subspan
                        ((Span<unsigned_char> *)&ssl_local,sStack_40,0xffffffffffffffff);
      local_68 = (SSL *)SVar2.data_;
      ssl_local = local_68;
      local_60 = (uchar *)SVar2.size_;
      out_local.data_ = local_60;
      len = sStack_40 + len;
    }
  } while (sVar1 != seal_flush);
  *(size_t *)total = len;
  return true;
}

Assistant:

static bool seal_next_packet(SSL *ssl, Span<uint8_t> out, size_t *out_len) {
  size_t total = 0;
  for (;;) {
    size_t len;
    seal_result_t ret = seal_next_record(ssl, out, &len);
    switch (ret) {
      case seal_error:
        return false;

      case seal_flush:
      case seal_continue:
        out = out.subspan(len);
        total += len;
        break;
    }

    if (ret == seal_flush) {
      break;
    }
  }

  *out_len = total;
  return true;
}